

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O1

void __thiscall Fl_Tree_Item::show_self(Fl_Tree_Item *this,char *indent)

{
  size_t sVar1;
  char *pcVar2;
  Fl_Tree_Item *pFVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = -1;
  pFVar3 = this;
  do {
    pFVar3 = pFVar3->_parent;
    iVar4 = iVar4 + 1;
  } while (pFVar3 != (Fl_Tree_Item *)0x0);
  pcVar2 = "(NULL)";
  if (this->_label != (char *)0x0) {
    pcVar2 = this->_label;
  }
  printf("%s-%s (%d children, this=%p, parent=%p depth=%d)\n",indent,pcVar2,
         (ulong)(uint)(this->_children)._total,this,this->_parent,iVar4);
  if ((this->_children)._total != 0) {
    sVar1 = strlen(indent);
    pcVar2 = (char *)operator_new__(sVar1 + 2);
    strcpy(pcVar2,indent);
    sVar1 = strlen(pcVar2);
    (pcVar2 + sVar1)[0] = ' ';
    (pcVar2 + sVar1)[1] = '|';
    pcVar2[sVar1 + 2] = '\0';
    if (0 < (this->_children)._total) {
      lVar5 = 0;
      do {
        show_self((this->_children)._items[lVar5],pcVar2);
        lVar5 = lVar5 + 1;
      } while (lVar5 < (this->_children)._total);
    }
    operator_delete__(pcVar2);
  }
  fflush(_stdout);
  return;
}

Assistant:

void Fl_Tree_Item::show_self(const char *indent) const {
  const char *thelabel = label() ? label() : "(NULL)";
#if FLTK_ABI_VERSION >= 10301
  printf("%s-%s (%d children, this=%p, parent=%p, prev=%p, next=%p, depth=%d)\n",
	 indent,thelabel,children(),(void*)this, (void*)_parent,
	 _prev_sibling, _next_sibling, depth());
#else /*FLTK_ABI_VERSION*/
  printf("%s-%s (%d children, this=%p, parent=%p depth=%d)\n",
	 indent,thelabel,children(),(void*)this, (void*)_parent, depth());
#endif /*FLTK_ABI_VERSION*/
  if ( children() ) {
    char *i2 = new char [strlen(indent)+2];
    strcpy(i2, indent);
    strcat(i2, " |");
    for ( int t=0; t<children(); t++ ) {
      child(t)->show_self(i2);
    }
    delete[] i2;
  }
  fflush(stdout);
}